

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preset.cpp
# Opt level: O0

void __thiscall sf2cute::SFPreset::set_global_zone(SFPreset *this,SFPresetZone *global_zone)

{
  bool bVar1;
  SFPreset *pSVar2;
  invalid_argument *this_00;
  SFPresetZone *local_18;
  SFPresetZone *global_zone_local;
  SFPreset *this_local;
  
  local_18 = global_zone;
  global_zone_local = (SFPresetZone *)this;
  bVar1 = SFPresetZone::has_parent_preset(global_zone);
  if (bVar1) {
    pSVar2 = SFPresetZone::parent_preset(global_zone);
    if (pSVar2 != this) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (this_00,"Preset zone has already been owned by another preset.");
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
  }
  else {
    SFPresetZone::set_parent_preset(global_zone,this);
    std::make_unique<sf2cute::SFPresetZone,sf2cute::SFPresetZone>
              ((SFPresetZone *)&stack0xffffffffffffffd0);
    std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>::operator=
              (&this->global_zone_,
               (unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_> *)
               &stack0xffffffffffffffd0);
    std::unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_>::~unique_ptr
              ((unique_ptr<sf2cute::SFPresetZone,_std::default_delete<sf2cute::SFPresetZone>_> *)
               &stack0xffffffffffffffd0);
  }
  return;
}

Assistant:

void SFPreset::set_global_zone(SFPresetZone global_zone) {
  // Check the parent preset of the zone.
  if (global_zone.has_parent_preset()) {
    if (&global_zone.parent_preset() == this) {
      // If the zone is already be owned by this preset, do nothing.
      return;
    }
    else {
      // Otherwise raise an error. A zone cannot be shared by two parents.
      throw std::invalid_argument("Preset zone has already been owned by another preset.");
    }
  }

  // Set this preset to the parent preset of the zone.
  global_zone.set_parent_preset(*this);

  // Set the global zone to this preset.
  global_zone_ = std::make_unique<SFPresetZone>(std::move(global_zone));
}